

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_f16c.cpp
# Opt level: O0

void ncnn::cast_fp32_to_fp16_sse_f16c(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Option *in_stack_00000160;
  Mat *in_stack_00000168;
  Mat *in_stack_00000170;
  
  cast_fp32_to_fp16_sse(in_stack_00000170,in_stack_00000168,in_stack_00000160);
  return;
}

Assistant:

void cast_fp32_to_fp16_sse_f16c(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
}